

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDFace::HasSharpEdges(ON_SubDFace *this)

{
  unsigned_short uVar1;
  ON_SubDEdgePtr *pOVar2;
  bool bVar3;
  ON_SubDEdgePtr *pOVar4;
  ON_SubDEdge *this_00;
  unsigned_short uVar5;
  
  uVar1 = this->m_edge_count;
  if (uVar1 != 0) {
    pOVar2 = this->m_edgex;
    pOVar4 = this->m_edge4;
    uVar5 = 0;
    do {
      if (uVar5 == 4) {
        pOVar4 = pOVar2;
      }
      if (uVar5 == 4 && pOVar2 == (ON_SubDEdgePtr *)0x0) {
        return false;
      }
      this_00 = (ON_SubDEdge *)(pOVar4->m_ptr & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) && (bVar3 = ON_SubDEdge::IsSharp(this_00), bVar3)) {
        return true;
      }
      uVar5 = uVar5 + 1;
      pOVar4 = pOVar4 + 1;
    } while (uVar1 != uVar5);
  }
  return false;
}

Assistant:

bool ON_SubDFace::HasSharpEdges() const
{
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr != e && e->IsSharp())
      return true;
  }
  return false;
}